

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

unique_function_record __thiscall pybind11::cpp_function::make_function_record(cpp_function *this)

{
  PyObject *pPVar1;
  
  pPVar1 = (PyObject *)operator_new(0x88);
  *(undefined4 *)((long)&pPVar1[5].ob_type + 6) = 0;
  pPVar1[6].ob_type = (PyTypeObject *)0x0;
  pPVar1[7].ob_refcnt = 0;
  pPVar1[7].ob_type = (PyTypeObject *)0x0;
  pPVar1[8].ob_refcnt = 0;
  pPVar1->ob_refcnt = 0;
  pPVar1->ob_type = (PyTypeObject *)0x0;
  pPVar1[1].ob_refcnt = 0;
  pPVar1[1].ob_type = (PyTypeObject *)0x0;
  pPVar1[2].ob_refcnt = 0;
  pPVar1[2].ob_type = (PyTypeObject *)0x0;
  pPVar1[3].ob_refcnt = 0;
  pPVar1[3].ob_type = (PyTypeObject *)0x0;
  pPVar1[4].ob_refcnt = 0;
  pPVar1[4].ob_type = (PyTypeObject *)0x0;
  *(undefined8 *)((long)&pPVar1[4].ob_type + 3) = 0;
  *(undefined8 *)((long)&pPVar1[5].ob_refcnt + 3) = 0;
  (this->super_function).super_object.super_handle.m_ptr = pPVar1;
  return (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
          )(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
            )this;
}

Assistant:

make_function_record() {
        return unique_function_record(new detail::function_record());
    }